

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void gray_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  JSAMPLE JVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  ulong uVar5;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    uVar2 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = (*input_buf)[input_row];
      pJVar4 = *output_buf + 2;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        JVar1 = pJVar3[uVar5];
        *pJVar4 = JVar1;
        pJVar4[-1] = JVar1;
        pJVar4[-2] = JVar1;
        pJVar4 = pJVar4 + 3;
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    uVar2 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = (*input_buf)[input_row];
      pJVar4 = *output_buf;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        JVar1 = pJVar3[uVar5];
        pJVar4[uVar5 * 4 + 2] = JVar1;
        pJVar4[uVar5 * 4 + 1] = JVar1;
        pJVar4[uVar5 * 4] = JVar1;
        pJVar4[uVar5 * 4 + 3] = 0xff;
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_BGR:
    uVar2 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = (*input_buf)[input_row];
      pJVar4 = *output_buf;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        JVar1 = pJVar3[uVar5];
        *pJVar4 = JVar1;
        pJVar4[1] = JVar1;
        pJVar4[2] = JVar1;
        pJVar4 = pJVar4 + 3;
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    uVar2 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = (*input_buf)[input_row];
      pJVar4 = *output_buf;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        JVar1 = pJVar3[uVar5];
        pJVar4[uVar5 * 4] = JVar1;
        pJVar4[uVar5 * 4 + 1] = JVar1;
        pJVar4[uVar5 * 4 + 2] = JVar1;
        pJVar4[uVar5 * 4 + 3] = 0xff;
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    uVar2 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = (*input_buf)[input_row];
      pJVar4 = *output_buf;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        JVar1 = pJVar3[uVar5];
        pJVar4[uVar5 * 4 + 1] = JVar1;
        pJVar4[uVar5 * 4 + 2] = JVar1;
        pJVar4[uVar5 * 4 + 3] = JVar1;
        pJVar4[uVar5 * 4] = 0xff;
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    uVar2 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = (*input_buf)[input_row];
      pJVar4 = *output_buf;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        JVar1 = pJVar3[uVar5];
        pJVar4[uVar5 * 4 + 3] = JVar1;
        pJVar4[uVar5 * 4 + 2] = JVar1;
        pJVar4[uVar5 * 4 + 1] = JVar1;
        pJVar4[uVar5 * 4] = 0xff;
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
    }
    break;
  default:
    uVar2 = cinfo->output_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar3 = (*input_buf)[input_row];
      pJVar4 = *output_buf + 2;
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        JVar1 = pJVar3[uVar5];
        *pJVar4 = JVar1;
        pJVar4[-1] = JVar1;
        pJVar4[-2] = JVar1;
        pJVar4 = pJVar4 + 3;
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                 JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    gray_extrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    gray_extrgbx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_BGR:
    gray_extbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    gray_extbgrx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    gray_extxbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    gray_extxrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  default:
    gray_rgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                              num_rows);
    break;
  }
}